

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonIterativeFeaturePreservingMeshFiltering.cpp
# Opt level: O1

void __thiscall
NonIterativeFeaturePreservingMeshFiltering::getVertexFaceNeighbor
          (NonIterativeFeaturePreservingMeshFiltering *this,TriMesh *mesh,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *face_centroid,VertexHandle vh,double r,
          vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *vertex_face_neighbor)

{
  pointer *ppFVar1;
  double dVar2;
  double dVar3;
  pointer pFVar4;
  pointer pVVar5;
  iterator __position;
  value_type vVar6;
  PropertyT<OpenMesh::VectorT<double,_3>_> *this_00;
  reference pvVar7;
  size_type __n;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  BaseHandle local_118;
  FaceHandle fh;
  undefined1 auStack_f8 [8];
  queue<OpenMesh::FaceHandle,_std::deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
  queue_face_handle;
  undefined1 local_88 [8];
  vector<bool,_std::allocator<bool>_> mark;
  undefined1 auStack_58 [8];
  vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> face_neighbor;
  BaseHandle local_34 [2];
  FaceHandle temp_fh;
  
  mark.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage
       = (_Bit_pointer)r;
  this_00 = OpenMesh::PropertyContainer::property<OpenMesh::VectorT<double,3>>
                      ((PropertyContainer *)
                       &(mesh->super_Mesh).
                        super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                        .
                        super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                        .field_0x8,
                       (BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                       (mesh->super_Mesh).
                       super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                       .
                       super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                       .points_.super_BasePropHandleT<OpenMesh::VectorT<double,_3>_>.
                       super_BaseHandle.idx_);
  pvVar7 = OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::operator[]
                     (this_00,(int)vh.super_BaseHandle.idx_);
  queue_face_handle.c.super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node =
       (_Map_pointer)(pvVar7->super_VectorDataT<double,_3>).values_[0];
  dVar2 = (pvVar7->super_VectorDataT<double,_3>).values_[1];
  dVar3 = (pvVar7->super_VectorDataT<double,_3>).values_[2];
  __n = (**(code **)(*(long *)&(mesh->super_Mesh).
                               super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                               .
                               super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                    + 0x28))(mesh);
  auStack_f8 = (undefined1  [8])((ulong)auStack_f8 & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_88,__n,(bool *)auStack_f8,
             (allocator_type *)auStack_58);
  pFVar4 = (vertex_face_neighbor->
           super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((vertex_face_neighbor->
      super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>)._M_impl.
      super__Vector_impl_data._M_finish != pFVar4) {
    (vertex_face_neighbor->
    super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>)._M_impl.
    super__Vector_impl_data._M_finish = pFVar4;
  }
  queue_face_handle.c.super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  queue_face_handle.c.super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  queue_face_handle.c.super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  queue_face_handle.c.super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  queue_face_handle.c.super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  queue_face_handle.c.super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  queue_face_handle.c.super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  queue_face_handle.c.super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  auStack_f8 = (undefined1  [8])0x0;
  queue_face_handle.c.super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  std::_Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::_M_initialize_map
            ((_Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)auStack_f8,
             0);
  OpenMesh::Iterators::
  GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
  ::GenericCirculatorT
            ((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
              *)auStack_58,(mesh_ref)mesh,(VertexHandle)vh.super_BaseHandle.idx_,false);
  mark.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage
       = (_Bit_pointer)
         ((double)mark.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                  _M_end_of_storage +
         (double)mark.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                 _M_end_of_storage);
  if (face_neighbor.super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
      _M_impl.super__Vector_impl_data._M_start._4_4_ != -1) {
    do {
      if (((int)face_neighbor.
                super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
                _M_impl.super__Vector_impl_data._M_start ==
           face_neighbor.
           super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
           super__Vector_impl_data._M_start._4_4_) &&
         ((int)face_neighbor.
               super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
               _M_impl.super__Vector_impl_data._M_finish != 0)) break;
      vVar6 = OpenMesh::Iterators::
              GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
              ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                           *)auStack_58);
      pVVar5 = (face_centroid->
               super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      dVar12 = (double)queue_face_handle.c.
                       super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node -
               pVVar5[(int)vVar6.super_BaseHandle.idx_].super_VectorDataT<double,_3>.values_[0];
      dVar13 = dVar2 - pVVar5[(int)vVar6.super_BaseHandle.idx_].super_VectorDataT<double,_3>.values_
                       [1];
      dVar11 = dVar3 - pVVar5[(int)vVar6.super_BaseHandle.idx_].super_VectorDataT<double,_3>.values_
                       [2];
      dVar11 = dVar11 * dVar11 + dVar12 * dVar12 + dVar13 * dVar13;
      if (dVar11 < 0.0) {
        dVar11 = sqrt(dVar11);
      }
      else {
        dVar11 = SQRT(dVar11);
      }
      if (dVar11 <= (double)mark.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage) {
        local_118.idx_ =
             (int)OpenMesh::Iterators::
                  GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                  ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                               *)auStack_58);
        if ((_Elt_pointer)
            queue_face_handle.c.
            super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
            super__Deque_impl_data._M_start._M_node ==
            queue_face_handle.c.
            super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
            super__Deque_impl_data._M_finish._M_first + -1) {
          std::deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::
          _M_push_back_aux<OpenMesh::FaceHandle>
                    ((deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
                     auStack_f8,(FaceHandle *)&stack0xfffffffffffffee8);
        }
        else {
          *(int *)queue_face_handle.c.
                  super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_node = local_118.idx_;
          queue_face_handle.c.
          super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
          super__Deque_impl_data._M_start._M_node =
               (_Map_pointer)
               ((long)queue_face_handle.c.
                      super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_node + 4);
        }
      }
      vVar6 = OpenMesh::Iterators::
              GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
              ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                           *)auStack_58);
      uVar9 = (ulong)(int)vVar6.super_BaseHandle.idx_;
      uVar8 = uVar9 + 0x3f;
      if (-1 < (long)uVar9) {
        uVar8 = uVar9;
      }
      *(ulong *)((long)local_88 +
                (((long)uVar8 >> 6) +
                ((ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001) - 1)) * 8) =
           *(ulong *)((long)local_88 +
                     (((long)uVar8 >> 6) +
                     ((ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001) - 1)) * 8) |
           1L << ((byte)vVar6.super_BaseHandle.idx_ & 0x3f);
      OpenMesh::Iterators::
      GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
      ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                    *)&stack0xfffffffffffffee8,
                   (GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                    *)auStack_58,0);
    } while (face_neighbor.
             super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl
             .super__Vector_impl_data._M_start._4_4_ != -1);
  }
  auStack_58 = (undefined1  [8])0x0;
  face_neighbor.super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  face_neighbor.super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (queue_face_handle.c.
      super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
      super__Deque_impl_data._M_start._M_node !=
      (_Map_pointer)
      queue_face_handle.c.
      super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
      super__Deque_impl_data._M_map_size) {
    do {
      local_118.idx_ =
           *(int *)queue_face_handle.c.
                   super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
                   _M_impl.super__Deque_impl_data._M_map_size;
      __position._M_current =
           (vertex_face_neighbor->
           super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (vertex_face_neighbor->
          super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<OpenMesh::FaceHandle,std::allocator<OpenMesh::FaceHandle>>::
        _M_realloc_insert<OpenMesh::FaceHandle_const&>
                  ((vector<OpenMesh::FaceHandle,std::allocator<OpenMesh::FaceHandle>> *)
                   vertex_face_neighbor,__position,(FaceHandle *)&stack0xfffffffffffffee8);
      }
      else {
        ((__position._M_current)->super_BaseHandle).idx_ = local_118.idx_;
        ppFVar1 = &(vertex_face_neighbor->
                   super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppFVar1 = *ppFVar1 + 1;
      }
      if ((_Elt_pointer)
          queue_face_handle.c.
          super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
          super__Deque_impl_data._M_map_size ==
          queue_face_handle.c.
          super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
          super__Deque_impl_data._M_start._M_first + -1) {
        operator_delete(queue_face_handle.c.
                        super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur);
        queue_face_handle.c.
        super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
        super__Deque_impl_data._M_map_size =
             *(size_t *)
              (queue_face_handle.c.
               super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
               _M_impl.super__Deque_impl_data._M_start._M_last + 2);
        queue_face_handle.c.
        super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
        super__Deque_impl_data._M_start._M_first =
             (_Elt_pointer)
             (queue_face_handle.c.
              super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl
              .super__Deque_impl_data._M_map_size + 0x200);
        queue_face_handle.c.
        super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur =
             (_Elt_pointer)
             queue_face_handle.c.
             super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
             super__Deque_impl_data._M_map_size;
        queue_face_handle.c.
        super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
        super__Deque_impl_data._M_start._M_last =
             queue_face_handle.c.
             super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
             super__Deque_impl_data._M_start._M_last + 2;
      }
      else {
        queue_face_handle.c.
        super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
        super__Deque_impl_data._M_map_size =
             queue_face_handle.c.
             super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
             super__Deque_impl_data._M_map_size + 4;
      }
      MeshDenoisingBase::getFaceNeighbor
                (&this->super_MeshDenoisingBase,mesh,(FaceHandle)local_118.idx_,kVertexBased,
                 (vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)auStack_58);
      if (0 < (int)((ulong)((long)face_neighbor.
                                  super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                  ._M_impl.super__Vector_impl_data._M_start - (long)auStack_58) >> 2
                   )) {
        lVar10 = 0;
        do {
          local_34[0].idx_ =
               *(int *)((long)&(((ArrayKernel *)auStack_58)->super_BaseKernel)._vptr_BaseKernel +
                       lVar10 * 4);
          uVar9 = (ulong)local_34[0].idx_;
          uVar8 = uVar9 + 0x3f;
          if (-1 < (long)uVar9) {
            uVar8 = uVar9;
          }
          if ((*(ulong *)((long)local_88 +
                         (((long)uVar8 >> 6) +
                         ((ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001) - 1)) * 8) >>
               (uVar9 & 0x3f) & 1) == 0) {
            pVVar5 = (face_centroid->
                     super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            dVar12 = (double)queue_face_handle.c.
                             super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_node -
                     pVVar5[uVar9].super_VectorDataT<double,_3>.values_[0];
            dVar13 = dVar2 - pVVar5[uVar9].super_VectorDataT<double,_3>.values_[1];
            dVar11 = dVar3 - pVVar5[uVar9].super_VectorDataT<double,_3>.values_[2];
            dVar11 = dVar11 * dVar11 + dVar12 * dVar12 + dVar13 * dVar13;
            if (dVar11 < 0.0) {
              dVar11 = sqrt(dVar11);
            }
            else {
              dVar11 = SQRT(dVar11);
            }
            if (dVar11 <= (double)mark.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_end_of_storage) {
              if ((_Elt_pointer)
                  queue_face_handle.c.
                  super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_node ==
                  queue_face_handle.c.
                  super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_first + -1) {
                std::deque<OpenMesh::FaceHandle,std::allocator<OpenMesh::FaceHandle>>::
                _M_push_back_aux<OpenMesh::FaceHandle_const&>
                          ((deque<OpenMesh::FaceHandle,std::allocator<OpenMesh::FaceHandle>> *)
                           auStack_f8,(FaceHandle *)local_34);
              }
              else {
                *(int *)queue_face_handle.c.
                        super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_node = local_34[0].idx_;
                queue_face_handle.c.
                super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
                _M_impl.super__Deque_impl_data._M_start._M_node =
                     (_Map_pointer)
                     ((long)queue_face_handle.c.
                            super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_node + 4);
              }
            }
            uVar9 = (ulong)local_34[0].idx_;
            uVar8 = uVar9 + 0x3f;
            if (-1 < (long)uVar9) {
              uVar8 = uVar9;
            }
            *(ulong *)((long)local_88 +
                      (((long)uVar8 >> 6) +
                      ((ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001) - 1)) * 8) =
                 *(ulong *)((long)local_88 +
                           (((long)uVar8 >> 6) +
                           ((ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001) - 1)) * 8) |
                 1L << ((byte)local_34[0].idx_ & 0x3f);
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < (int)((ulong)((long)face_neighbor.
                                              super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                              ._M_impl.super__Vector_impl_data._M_start -
                                       (long)auStack_58) >> 2));
      }
    } while (queue_face_handle.c.
             super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
             super__Deque_impl_data._M_start._M_node !=
             (_Map_pointer)
             queue_face_handle.c.
             super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
             super__Deque_impl_data._M_map_size);
  }
  if (auStack_58 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_58);
  }
  std::_Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::~_Deque_base
            ((_Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)auStack_f8)
  ;
  if (local_88 != (undefined1  [8])0x0) {
    operator_delete((void *)local_88);
  }
  return;
}

Assistant:

void NonIterativeFeaturePreservingMeshFiltering::getVertexFaceNeighbor(TriMesh &mesh, std::vector<TriMesh::Point> &face_centroid, TriMesh::VertexHandle vh, double r,
                                                                       std::vector<TriMesh::FaceHandle> &vertex_face_neighbor)
{
    double radius = 2.0 * r;
    TriMesh::Point point = mesh.point(vh);

    std::vector<bool> mark(mesh.n_faces(), false);
    vertex_face_neighbor.clear();
    std::queue<TriMesh::FaceHandle> queue_face_handle;
    for(TriMesh::VertexFaceIter vf_it = mesh.vf_iter(vh); vf_it.is_valid(); vf_it++)
    {
        TriMesh::Point centroid = face_centroid[(*vf_it).idx()];
        double length = (point - centroid).length();
        if( length <= radius )
            queue_face_handle.push(*vf_it);
        mark[(*vf_it).idx()] = true;
    }

    std::vector<TriMesh::FaceHandle> face_neighbor;

    while(!queue_face_handle.empty())
    {
        TriMesh::FaceHandle fh = queue_face_handle.front();
        vertex_face_neighbor.push_back(fh);
        queue_face_handle.pop();
        getFaceNeighbor(mesh, fh, kVertexBased, face_neighbor);
        for(int i = 0; i < (int)face_neighbor.size(); i++)
        {
            TriMesh::FaceHandle temp_fh = face_neighbor[i];
            if(mark[temp_fh.idx()] == false)
            {
                TriMesh::Point centroid = face_centroid[temp_fh.idx()];
                double length = (point - centroid).length();
                if(length <= radius)
                    queue_face_handle.push(temp_fh);
                mark[temp_fh.idx()] = true;
            }
        }
    }
}